

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O0

bool __thiscall
duckdb::RowGroupCollection::Scan
          (RowGroupCollection *this,DuckTransaction *transaction,
          function<bool_(duckdb::DataChunk_&)> *fun)

{
  bool bVar1;
  size_type sVar2;
  unsigned_long *in_RDI;
  idx_t i;
  vector<duckdb::StorageIndex,_true> column_ids;
  function<bool_(duckdb::DataChunk_&)> *in_stack_00000270;
  vector<duckdb::StorageIndex,_true> *in_stack_00000278;
  DuckTransaction *in_stack_00000280;
  RowGroupCollection *in_stack_00000288;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *this_00;
  ulong local_48;
  size_type in_stack_ffffffffffffffc8;
  pointer in_stack_ffffffffffffffd0;
  
  this_00 = (vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *)
            &stack0xffffffffffffffd0;
  vector<duckdb::StorageIndex,_true>::vector((vector<duckdb::StorageIndex,_true> *)0xbaec5c);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(in_RDI + 5));
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::reserve
            ((vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *)
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_48 = 0;
  while( true ) {
    sVar2 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                      ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                       (in_RDI + 5));
    if (sVar2 <= local_48) break;
    ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
    emplace_back<unsigned_long&>(this_00,in_RDI);
    local_48 = local_48 + 1;
  }
  bVar1 = Scan(in_stack_00000288,in_stack_00000280,in_stack_00000278,in_stack_00000270);
  vector<duckdb::StorageIndex,_true>::~vector((vector<duckdb::StorageIndex,_true> *)0xbaed0d);
  return bVar1;
}

Assistant:

bool RowGroupCollection::Scan(DuckTransaction &transaction, const std::function<bool(DataChunk &chunk)> &fun) {
	vector<StorageIndex> column_ids;
	column_ids.reserve(types.size());
	for (idx_t i = 0; i < types.size(); i++) {
		column_ids.emplace_back(i);
	}
	return Scan(transaction, column_ids, fun);
}